

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O2

bool __thiscall QErrorMessagePrivate::nextPending(QErrorMessagePrivate *this)

{
  queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
  *this_00;
  _Elt_pointer pMVar1;
  _Elt_pointer pMVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  bool bVar9;
  reference pvVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->pending;
  do {
    pMVar1 = (this->pending).c.
             super__Deque_base<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pMVar2 = (this->pending).c.
             super__Deque_base<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pMVar2 == pMVar1) {
LAB_00494c3e:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return pMVar2 != pMVar1;
      }
      __stack_chk_fail();
    }
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pvVar10 = std::
              queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
              ::front(this_00);
    local_58.d = (pvVar10->content).d.d;
    local_58.ptr = (pvVar10->content).d.ptr;
    (pvVar10->content).d.d = (Data *)0x0;
    (pvVar10->content).d.ptr = (char16_t *)0x0;
    local_58.size = (pvVar10->content).d.size;
    (pvVar10->content).d.size = 0;
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pvVar10 = std::
              queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
              ::front(this_00);
    local_78.d = (pvVar10->type).d.d;
    local_78.ptr = (pvVar10->type).d.ptr;
    (pvVar10->type).d.d = (Data *)0x0;
    (pvVar10->type).d.ptr = (char16_t *)0x0;
    local_78.size = (pvVar10->type).d.size;
    (pvVar10->type).d.size = 0;
    std::
    queue<QErrorMessagePrivate::Message,_std::deque<QErrorMessagePrivate::Message,_std::allocator<QErrorMessagePrivate::Message>_>_>
    ::pop(this_00);
    bVar9 = isMessageToBeShown(this,(QString *)&local_58,(QString *)&local_78);
    if (bVar9) {
      QTextEdit::setHtml(this->errors,(QString *)&local_58);
      pDVar5 = (this->currentMessage).d.d;
      pcVar6 = (this->currentMessage).d.ptr;
      (this->currentMessage).d.d = local_58.d;
      (this->currentMessage).d.ptr = local_58.ptr;
      qVar3 = (this->currentMessage).d.size;
      (this->currentMessage).d.size = local_58.size;
      pDVar7 = (this->currentType).d.d;
      pcVar8 = (this->currentType).d.ptr;
      (this->currentType).d.d = local_78.d;
      (this->currentType).d.ptr = local_78.ptr;
      qVar4 = (this->currentType).d.size;
      (this->currentType).d.size = local_78.size;
      local_78.d = pDVar7;
      local_78.ptr = pcVar8;
      local_78.size = qVar4;
      local_58.d = pDVar5;
      local_58.ptr = pcVar6;
      local_58.size = qVar3;
      QAbstractButton::setChecked(&this->again->super_QAbstractButton,true);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      goto LAB_00494c3e;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  } while( true );
}

Assistant:

bool QErrorMessagePrivate::nextPending()
{
    while (!pending.empty()) {
        QString message = std::move(pending.front().content);
        QString type = std::move(pending.front().type);
        pending.pop();
        if (isMessageToBeShown(message, type)) {
#ifndef QT_NO_TEXTHTMLPARSER
            errors->setHtml(message);
#else
            errors->setPlainText(message);
#endif
            currentMessage = std::move(message);
            currentType = std::move(type);
            again->setChecked(true);
            return true;
        }
    }
    return false;
}